

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::UmulExtendedCase::compare
          (UmulExtendedCase *this,void **inputs,void **outputs)

{
  DataType dataType;
  int iVar1;
  reference pvVar2;
  long lVar3;
  ostream *poVar4;
  Hex<8UL> HVar5;
  deUint32 ref1;
  deUint32 ref0;
  deUint64 mul64;
  deUint32 out1;
  deUint32 out0;
  deUint32 in1;
  deUint32 in0;
  int compNdx;
  int scalarSize;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  UmulExtendedCase *this_local;
  
  pvVar2 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar2->varType);
  iVar1 = glu::getDataTypeScalarSize(dataType);
  in1 = 0;
  while( true ) {
    if (iVar1 <= (int)in1) {
      return true;
    }
    lVar3 = (ulong)*(uint *)((long)*inputs + (long)(int)in1 * 4) *
            (ulong)*(uint *)((long)inputs[1] + (long)(int)in1 * 4);
    if (lVar3 != CONCAT44(*(undefined4 *)((long)*outputs + (long)(int)in1 * 4),
                          *(undefined4 *)((long)outputs[1] + (long)(int)in1 * 4))) break;
    in1 = in1 + 1;
  }
  poVar4 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in1);
  poVar4 = std::operator<<(poVar4,"] = ");
  HVar5 = tcu::toHex<unsigned_int>((uint)((ulong)lVar3 >> 0x20));
  poVar4 = tcu::Format::operator<<(poVar4,HVar5);
  poVar4 = std::operator<<(poVar4,", ");
  HVar5 = tcu::toHex<unsigned_int>((uint)lVar3);
  tcu::Format::operator<<(poVar4,HVar5);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint64	mul64	= deUint64(in0)*deUint64(in1);
			const deUint32	ref0	= deUint32(mul64 >> 32);
			const deUint32	ref1	= deUint32(mul64 & 0xffffffffu);

			if (out0 != ref0 || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}